

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,SchnorrPubkey *schnorr_pubkey,string *parent_key_information)

{
  byte bVar1;
  string *parent_key_information_local;
  SchnorrPubkey *schnorr_pubkey_local;
  DescriptorKeyInfo *this_local;
  
  this->key_type_ = kDescriptorKeySchnorr;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_,schnorr_pubkey);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::__cxx11::string::string((string *)&this->parent_info_);
  ::std::__cxx11::string::string((string *)&this->path_);
  ::std::__cxx11::string::string((string *)&this->key_string_);
  bVar1 = ::std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    ::std::__cxx11::string::operator=
              ((string *)&this->parent_info_,(string *)parent_key_information);
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const SchnorrPubkey& schnorr_pubkey,
    const std::string parent_key_information)
    : key_type_(DescriptorKeyType::kDescriptorKeySchnorr),
      schnorr_pubkey_(schnorr_pubkey) {
  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
}